

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall t_st_generator::generate_service_client(t_st_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  ostream *poVar1;
  pointer pptVar2;
  string funname;
  string signature;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_client;
  string extends;
  string local_1e8;
  string local_1c8;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_1a8;
  string local_190;
  allocator local_170 [32];
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_130,"",local_170);
  std::__cxx11::string::string((string *)local_170,"TClient",(allocator *)&local_1e8);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_1a8,&tservice->functions_
            );
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_1e8,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::operator+(&local_1e8,&local_130,"Client");
    std::__cxx11::string::operator=((string *)local_170,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  out = &this->f_;
  poVar1 = std::operator<<((ostream *)out,(string *)local_170);
  poVar1 = std::operator<<(poVar1," subclass: #");
  client_class_name_abi_cxx11_(&local_150,this);
  prefix(&local_1e8,this,&local_150);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"\tinstanceVariableNames: \'\'\n");
  poVar1 = std::operator<<(poVar1,"\tclassVariableNames: \'\'\n");
  poVar1 = std::operator<<(poVar1,"\tpoolDictionaries: \'\'\n");
  poVar1 = std::operator<<(poVar1,"\tcategory: \'");
  generated_category_abi_cxx11_(&local_1c8,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  std::operator<<(poVar1,"\'!\n\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_150);
  for (pptVar2 = local_1a8._M_impl.super__Vector_impl_data._M_start;
      pptVar2 != local_1a8._M_impl.super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    std::__cxx11::string::string((string *)&local_90,(string *)&(*pptVar2)->name_);
    t_generator::camelcase(&local_1e8,(t_generator *)this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    function_signature_abi_cxx11_(&local_1c8,this,*pptVar2);
    client_class_name_abi_cxx11_(&local_50,this);
    std::__cxx11::string::string((string *)&local_70,(string *)&local_1c8);
    st_method(this,(ostream *)out,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    function_types_comment_abi_cxx11_(&local_b0,this,*pptVar2);
    poVar1 = std::operator<<((ostream *)out,(string *)&local_b0);
    poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_190);
    poVar1 = std::operator<<(poVar1,"self send");
    std::__cxx11::string::string((string *)&local_f0,(string *)&local_1c8);
    t_generator::capitalize(&local_d0,(t_generator *)this,&local_f0);
    poVar1 = std::operator<<(poVar1,(string *)&local_d0);
    poVar1 = std::operator<<(poVar1,".");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_b0);
    if ((*pptVar2)->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar1 = std::operator<<((ostream *)out,(string *)&local_b0);
      poVar1 = std::operator<<(poVar1,"^ self recv");
      std::__cxx11::string::string((string *)&local_110,(string *)&local_1e8);
      t_generator::capitalize(&local_190,(t_generator *)this,&local_110);
      poVar1 = std::operator<<(poVar1,(string *)&local_190);
      poVar1 = std::operator<<(poVar1," success ");
      std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    st_close_method(this,(ostream *)out);
    generate_send_method(this,*pptVar2);
    if ((*pptVar2)->oneway_ == false) {
      generate_recv_method(this,*pptVar2);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_1a8);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void t_st_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "TClient";
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = extends + "Client";
  }

  f_ << extends_client << " subclass: #" << prefix(client_class_name()) << endl
     << "\tinstanceVariableNames: ''\n"
     << "\tclassVariableNames: ''\n"
     << "\tpoolDictionaries: ''\n"
     << "\tcategory: '" << generated_category() << "'!\n\n";

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = camelcase((*f_iter)->get_name());
    string signature = function_signature(*f_iter);

    st_method(f_, client_class_name(), signature);
    f_ << function_types_comment(*f_iter) << endl << indent() << "self send"
       << capitalize(signature) << "." << endl;

    if (!(*f_iter)->is_oneway()) {
      f_ << indent() << "^ self recv" << capitalize(funname) << " success " << endl;
    }

    st_close_method(f_);

    generate_send_method(*f_iter);
    if (!(*f_iter)->is_oneway()) {
      generate_recv_method(*f_iter);
    }
  }
}